

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ConstPromiseNode<unsigned_long,_0UL>::get
          (ConstPromiseNode<unsigned_long,_0UL> *this,ExceptionOrValue *output)

{
  ExceptionOr<unsigned_long> *this_00;
  unsigned_long local_1c8;
  ExceptionOr<unsigned_long> local_1c0;
  ExceptionOrValue *local_18;
  ExceptionOrValue *output_local;
  ConstPromiseNode<unsigned_long,_0UL> *this_local;
  
  local_1c8 = 0;
  local_18 = output;
  output_local = (ExceptionOrValue *)this;
  ExceptionOr<unsigned_long>::ExceptionOr(&local_1c0,&local_1c8);
  this_00 = ExceptionOrValue::as<unsigned_long>(local_18);
  ExceptionOr<unsigned_long>::operator=(this_00,&local_1c0);
  ExceptionOr<unsigned_long>::~ExceptionOr(&local_1c0);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    output.as<T>() = value;
  }